

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_config.c
# Opt level: O1

void mk_config_sanity_check(mk_server *server)

{
  int __fd;
  uint __oflag;
  
  if (server->path_conf_root != (char *)0x0) {
    __oflag = server->open_flags | 0x40000;
    __fd = open(server->path_conf_root,__oflag);
    if (-1 < __fd) {
      server->open_flags = __oflag;
      close(__fd);
      return;
    }
  }
  return;
}

Assistant:

void mk_config_sanity_check(struct mk_server *server)
{
    /* Check O_NOATIME for current user, flag will just be used
     * if running user is allowed to.
     */
    int fd;
    int flags;

    if (!server->path_conf_root) {
        return;
    }

    flags = server->open_flags;
    flags |= O_NOATIME;
    fd = open(server->path_conf_root, flags);

    if (fd > -1) {
        server->open_flags = flags;
        close(fd);
    }
}